

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O3

int prf_model_traverse_df(prf_model_t *model,prf_cb_t callback)

{
  int iVar1;
  prf_node_t *ppVar2;
  prf_node_t **elem;
  int iVar3;
  int iVar4;
  prf_state_t *state;
  void *pvVar5;
  void *pvVar6;
  undefined8 *id;
  int *id_00;
  int *id_01;
  prf_nodeinfo_t *ppVar7;
  ulong uVar8;
  long lVar9;
  
  state = prf_state_create();
  state->model = model;
  pvVar5 = prf_array_init(8,8);
  iVar4 = 1;
  pvVar6 = prf_array_init(1,8);
  pvVar6 = prf_array_append_ptr(pvVar6,model->header);
  id = (undefined8 *)prf_array_append_ptr(pvVar5,pvVar6);
  pvVar5 = prf_array_init(4,4);
  uVar8 = 0;
  id_00 = (int *)prf_array_append_int(pvVar5,0);
  pvVar5 = prf_array_init(4,4);
  iVar3 = prf_array_count((void *)*id);
  id_01 = (int *)prf_array_append_int(pvVar5,iVar3);
LAB_00102602:
  do {
    if (*id_01 <= *id_00) {
LAB_0010284c:
      prf_state_destroy(state);
      prf_array_free(id);
      prf_array_free(pvVar6);
      prf_array_free(id_00);
      prf_array_free(id_01);
      return iVar4;
    }
    lVar9 = (long)(int)uVar8;
    ppVar2 = *(prf_node_t **)(id[lVar9] + (long)id_00[lVar9] * 8);
    ppVar7 = prf_nodeinfo_get(ppVar2->opcode);
    if ((ppVar7 != (prf_nodeinfo_t *)0x0) &&
       (ppVar7->entry_f != (_func_void_prf_node_t_ptr_prf_state_t_ptr *)0x0)) {
      (*ppVar7->entry_f)(ppVar2,state);
    }
    elem = ppVar2->children;
    while (iVar3 = (int)uVar8, elem != (prf_node_t **)0x0) {
      lVar9 = lVar9 + 1;
      id = (undefined8 *)prf_array_append_ptr(id,elem);
      id_00 = (int *)prf_array_append_int(id_00,0);
      iVar4 = prf_array_count((void *)id[lVar9]);
      id_01 = (int *)prf_array_append_int(id_01,iVar4);
      prf_state_push(state);
      state->physical_level = state->physical_level + 1;
      ppVar2 = *(prf_node_t **)(id[lVar9] + (long)id_00[lVar9] * 8);
      ppVar7 = prf_nodeinfo_get(ppVar2->opcode);
      if (ppVar7->entry_f != (_func_void_prf_node_t_ptr_prf_state_t_ptr *)0x0) {
        (*ppVar7->entry_f)(ppVar2,state);
      }
      uVar8 = (ulong)(iVar3 + 1);
      elem = ppVar2->children;
    }
    state->node = ppVar2;
    iVar4 = (*callback.func)(state,callback.data);
    if (iVar4 != 3) {
      if (iVar4 == 0) goto LAB_0010284c;
      iVar1 = id_00[iVar3];
      id_00[iVar3] = iVar1 + 1;
      if ((0 < iVar3) && (id_01[iVar3] <= iVar1 + 1)) {
        iVar4 = prf_array_count(id);
        id = (undefined8 *)prf_array_set_count(id,iVar4 + -1);
        iVar4 = prf_array_count(id_00);
        id_00 = (int *)prf_array_set_count(id_00,iVar4 + -1);
        iVar4 = prf_array_count(id_01);
        id_01 = (int *)prf_array_set_count(id_01,iVar4 + -1);
        prf_state_pop(state);
        uVar8 = (ulong)(iVar3 - 1);
        state->physical_level = state->physical_level - 1;
        ppVar2 = *(prf_node_t **)(id[uVar8] + (long)id_00[uVar8] * 8);
        prf_nodeinfo_get(ppVar2->opcode);
        state->node = ppVar2;
        iVar4 = (*callback.func)(state,callback.data);
        if (iVar4 == 0) {
          iVar4 = 0;
          goto LAB_0010284c;
        }
        id_00[uVar8] = id_00[uVar8] + 1;
      }
      goto LAB_00102602;
    }
    ppVar7 = prf_nodeinfo_get(**(uint16_t **)(id[iVar3] + (long)id_00[iVar3] * 8));
    do {
      if (ppVar7->exit_f != (_func_void_prf_node_t_ptr_prf_state_t_ptr *)0x0) {
        (*ppVar7->exit_f)(*(prf_node_t **)(id[iVar3] + (long)id_00[iVar3] * 8),state);
      }
      iVar4 = id_00[iVar3];
      id_00[iVar3] = iVar4 + 1;
      ppVar7 = prf_nodeinfo_get(**(uint16_t **)(id[iVar3] + 8 + (long)iVar4 * 8));
      if (ppVar7->entry_f != (_func_void_prf_node_t_ptr_prf_state_t_ptr *)0x0) {
        (*ppVar7->entry_f)(*(prf_node_t **)(id[iVar3] + (long)id_00[iVar3] * 8),state);
      }
    } while ((ppVar7->flags & 2) == 0);
    iVar4 = 3;
  } while( true );
}

Assistant:

int
prf_model_traverse_df( /* depth-first traversal */
    prf_model_t * model,
    prf_cb_t callback )
{
    prf_node_t *** stack, * node;
    prf_node_t ** array;
    int * child, * limit, level, traverse;
    prf_state_t * state;
    prf_nodeinfo_t * info;
    /* only losers recurse ;) */

    assert( model != NULL );
    assert( model->header != NULL );

    state = prf_state_create();
    state->model = model;
    stack = (prf_node_t ***)prf_array_init( 8, sizeof( prf_node_t ** ) );
    assert( stack != NULL );
    array = (prf_node_t **)prf_array_init( 1, sizeof( prf_node_t * ) );
    assert( array != NULL );
    array = (prf_node_t **)prf_array_append_ptr( array, model->header );
    stack = (prf_node_t ***)prf_array_append_ptr( stack, array );
    child = (int *)prf_array_init( 4, sizeof( int ) );
    assert( child != NULL );
    child = (int *)prf_array_append_int( child, 0 );
    limit = (int *)prf_array_init( 4, sizeof( int ) );
    assert( limit != NULL );
    limit = (int *)prf_array_append_int( limit, prf_array_count(stack[0]));
    traverse = PRF_TRAV_CONTINUE;

    level = 0;
    while ( child[0] < limit[0] ) {
        node = stack[level][child[level]];
        info = prf_nodeinfo_get( node->opcode );

        if ( (info != NULL) && (info->entry_f != NULL) )
            (*info->entry_f)(node, state);

        while ( node->children != NULL ) {
            stack = (prf_node_t ***)prf_array_append_ptr(stack,node->children);
            child = (int *)prf_array_append_int( child, 0 );
            limit = (int *)prf_array_append_int(limit, prf_array_count(stack[level+1]));
            prf_state_push( state );
            level++;
            state->physical_level++;
            node = stack[level][child[level]];
            info = prf_nodeinfo_get( node->opcode );
            if ( info->entry_f != NULL )
                (*info->entry_f)(node, state);
        }

        state->node = node;
        traverse = prf_cb_call( callback, state );

        if ( traverse == PRF_TRAV_EXIT )
            break;

        if ( traverse == PRF_TRAV_POP ) {
            prf_nodeinfo_t * info;
            info = prf_nodeinfo_get( stack[level][child[level]]->opcode );
            do {
                if ( info->exit_f != NULL )
                    (*(info->exit_f))( stack[level][child[level]], state );
                
                child[level]++;
                info = prf_nodeinfo_get( stack[level][child[level]]->opcode );
                if ( info->entry_f != NULL )
                    (*(info->entry_f))( stack[level][child[level]], state );
            } while ( (info->flags & PRF_POP_NODE) == 0 );
            continue;
        }

        child[level]++;

        if ( (level > 0) && (child[level] >= limit[level]) ) {
            stack = (prf_node_t ***)prf_array_set_count( stack, prf_array_count( stack ) - 1 );
            child = (int *)prf_array_set_count( child, prf_array_count( child ) - 1 );
            limit = (int *)prf_array_set_count( limit, prf_array_count( limit ) - 1 );
            prf_state_pop( state );
            level--;
            state->physical_level--;

            node = stack[level][child[level]];
            info = prf_nodeinfo_get( node->opcode );

            state->node = node;
            traverse = prf_cb_call( callback, state );

            if ( traverse == PRF_TRAV_EXIT )
                break;

            child[level]++;
        }
    }

    prf_state_destroy( state );
    prf_array_free( stack );
    prf_array_free( array );
    prf_array_free( child );
    prf_array_free( limit );
    return traverse;
}